

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O2

uint mdb_midl_search(MDB_IDL ids,MDB_ID id)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = (uint)*ids;
  uVar7 = 1;
  uVar2 = 0;
  uVar4 = 0;
  while( true ) {
    iVar6 = (int)uVar2;
    uVar2 = uVar7;
    while( true ) {
      if (uVar5 == 0) {
        return (int)uVar2 + (uint)(0 < (int)uVar4);
      }
      uVar3 = uVar5 >> 1;
      uVar1 = iVar6 + 1 + uVar3;
      uVar2 = (ulong)uVar1;
      uVar7 = ids[uVar2];
      uVar4 = (uint)(id < uVar7);
      if (id <= uVar7) break;
      uVar4 = 0xffffffff;
      uVar5 = uVar3;
    }
    if (uVar7 <= id) break;
    uVar5 = uVar5 + ~uVar3;
    uVar7 = (ulong)uVar1;
  }
  return uVar1;
}

Assistant:

unsigned mdb_midl_search( MDB_IDL ids, MDB_ID id )
{
	/*
	 * binary search of id in ids
	 * if found, returns position of id
	 * if not found, returns first position greater than id
	 */
	unsigned base = 0;
	unsigned cursor = 1;
	int val = 0;
	unsigned n = ids[0];

	while( 0 < n ) {
		unsigned pivot = n >> 1;
		cursor = base + pivot + 1;
		val = CMP( ids[cursor], id );

		if( val < 0 ) {
			n = pivot;

		} else if ( val > 0 ) {
			base = cursor;
			n -= pivot + 1;

		} else {
			return cursor;
		}
	}

	if( val > 0 ) {
		++cursor;
	}
	return cursor;
}